

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_signature.c
# Opt level: O0

signature signature_create(size_t count)

{
  set psVar1;
  signature_node psVar2;
  ulong in_RDI;
  signature_node node;
  size_t index;
  signature s;
  set_cb_compare in_stack_ffffffffffffffe0;
  ulong index_00;
  signature local_8;
  
  local_8 = (signature)malloc(in_RDI * 0x18 + 0x18);
  if (local_8 == (signature)0x0) {
    local_8 = (signature)0x0;
  }
  else {
    psVar1 = set_create((set_cb_hash)local_8,in_stack_ffffffffffffffe0);
    local_8->map = psVar1;
    if (local_8->map == (set)0x0) {
      log_write_impl_va("metacall",0x5e,"signature_create",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_signature.c"
                        ,LOG_LEVEL_ERROR,"Invalid signature set allocation");
      free(local_8);
      local_8 = (signature)0x0;
    }
    else {
      local_8->ret = (type)0x0;
      local_8->count = in_RDI;
      for (index_00 = 0; index_00 < in_RDI; index_00 = index_00 + 1) {
        psVar2 = signature_at(local_8,index_00);
        if (psVar2 != (signature_node)0x0) {
          psVar2->index = 0xffffffffffffffff;
          psVar2->name = (char *)0x0;
          psVar2->t = (type)0x0;
        }
      }
    }
  }
  return local_8;
}

Assistant:

signature signature_create(size_t count)
{
	signature s = malloc(sizeof(struct signature_type) + sizeof(struct signature_node_type) * count);

	if (s != NULL)
	{
		size_t index;

		s->map = set_create(&hash_callback_str, &comparable_callback_str);

		if (s->map == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid signature set allocation");

			free(s);

			return NULL;
		}

		s->ret = NULL;

		s->count = count;

		for (index = 0; index < count; ++index)
		{
			signature_node node = signature_at(s, index);

			if (node != NULL)
			{
				node->index = REFLECT_SIGNATURE_INVALID_INDEX;
				node->name = NULL;
				node->t = NULL;
			}
		}

		return s;
	}

	return NULL;
}